

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O2

int scan_JPEG_header(int verbose,int raw)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  bool bVar11;
  
  iVar2 = getc((FILE *)infile);
  iVar3 = getc((FILE *)infile);
  if ((iVar2 != 0xff) || (iVar3 != 0xd8)) {
    pcVar10 = "Not a JPEG file";
LAB_00101602:
    fprintf(_stderr,"%s\n",pcVar10);
    exit(1);
  }
LAB_0010144c:
  while( true ) {
    iVar2 = 0;
    do {
      iVar9 = iVar2;
      iVar3 = read_1_byte();
      iVar2 = iVar9 + 1;
    } while (iVar3 != 0xff);
    do {
      iVar2 = read_1_byte();
    } while (iVar2 == 0xff);
    if (iVar9 != 0) {
      fwrite("Warning: garbage data found in JPEG file\n",0x29,1,_stderr);
    }
    uVar1 = iVar2 - 0xc0;
    if ((((3 < uVar1) && (2 < iVar2 - 0xc5U)) && (2 < iVar2 - 0xc9U)) && (2 < iVar2 - 0xcdU)) break;
    if (verbose == 0) goto LAB_001015b0;
    uVar4 = read_2_bytes();
    uVar5 = read_1_byte();
    uVar6 = read_2_bytes();
    uVar7 = read_2_bytes();
    uVar8 = read_1_byte();
    pcVar10 = "Unknown";
    if (uVar1 < 0x10) {
      pcVar10 = &DAT_001023a0 + *(int *)(&DAT_001023a0 + (ulong)uVar1 * 4);
    }
    printf("JPEG image is %uw * %uh, %d color components, %d bits per sample\n",(ulong)uVar7,
           (ulong)uVar6,(ulong)uVar8,(ulong)uVar5);
    printf("JPEG process: %s\n",pcVar10);
    if (uVar4 != uVar8 * 3 + 8) {
      pcVar10 = "Bogus SOF marker length";
      goto LAB_00101602;
    }
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    while (bVar11 = uVar8 != 0, uVar8 = uVar8 - 1, bVar11) {
      read_1_byte();
      read_1_byte();
      read_1_byte();
    }
  }
  if (iVar2 == 0xec) {
    if (verbose != 0) {
      puts("APP12 contains:");
      goto LAB_001015a2;
    }
  }
  else {
    if (iVar2 == 0xfe) {
LAB_001015a2:
      process_COM(raw);
      goto LAB_0010144c;
    }
    if (iVar2 - 0xd9U < 2) {
      return iVar2 - 0xcdU;
    }
  }
LAB_001015b0:
  skip_variable();
  goto LAB_0010144c;
}

Assistant:

static int
scan_JPEG_header(int verbose, int raw)
{
  int marker;

  /* Expect SOI at start of file */
  if (first_marker() != M_SOI)
    ERREXIT("Expected SOI marker first");

  /* Scan miscellaneous markers until we reach SOS. */
  for (;;) {
    marker = next_marker();
    switch (marker) {
      /* Note that marker codes 0xC4, 0xC8, 0xCC are not, and must not be,
       * treated as SOFn.  C4 in particular is actually DHT.
       */
    case M_SOF0:                /* Baseline */
    case M_SOF1:                /* Extended sequential, Huffman */
    case M_SOF2:                /* Progressive, Huffman */
    case M_SOF3:                /* Lossless, Huffman */
    case M_SOF5:                /* Differential sequential, Huffman */
    case M_SOF6:                /* Differential progressive, Huffman */
    case M_SOF7:                /* Differential lossless, Huffman */
    case M_SOF9:                /* Extended sequential, arithmetic */
    case M_SOF10:               /* Progressive, arithmetic */
    case M_SOF11:               /* Lossless, arithmetic */
    case M_SOF13:               /* Differential sequential, arithmetic */
    case M_SOF14:               /* Differential progressive, arithmetic */
    case M_SOF15:               /* Differential lossless, arithmetic */
      if (verbose)
        process_SOFn(marker);
      else
        skip_variable();
      break;

    case M_SOS:                 /* stop before hitting compressed data */
      return marker;

    case M_EOI:                 /* in case it's a tables-only JPEG stream */
      return marker;

    case M_COM:
      process_COM(raw);
      break;

    case M_APP12:
      /* Some digital camera makers put useful textual information into
       * APP12 markers, so we print those out too when in -verbose mode.
       */
      if (verbose) {
        printf("APP12 contains:\n");
        process_COM(raw);
      } else
        skip_variable();
      break;

    default:                    /* Anything else just gets skipped */
      skip_variable();          /* we assume it has a parameter count... */
      break;
    }
  } /* end loop */
}